

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure.h
# Opt level: O2

void ublib::impl::failwith_rec<char_const*,char[20]>(char **t,char (*ts) [20])

{
  std::operator<<((ostream *)&std::cerr,*t);
  failwith_rec<char[20]>(ts);
  return;
}

Assistant:

void failwith_rec(T const& t, Ts const&... ts) {
    std::cerr << t;
    failwith_rec(ts...);
  }